

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O1

void __thiscall Scine::Core::ModuleManager::Impl::tryLoadModulesInPath(Impl *this,path *directory)

{
  directory_iterator end;
  _Alloc_hider local_30;
  directory_iterator local_28;
  directory_iterator local_20;
  
  boost::filesystem::detail::status((path *)&local_30,(error_code *)directory);
  if ((int)local_30._M_p == 3) {
    local_30._M_p = (pointer)0x0;
    boost::filesystem::directory_iterator::directory_iterator(&local_20,directory,none);
    local_28.m_imp.px =
         (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
         (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_30._M_p;
    if ((int *)local_30._M_p != (int *)0x0) {
      LOCK();
      *(int *)local_30._M_p = *(int *)local_30._M_p + 1;
      UNLOCK();
    }
    std::
    for_each<boost::filesystem::directory_iterator,Scine::Core::ModuleManager::Impl::tryLoadModulesInPath(boost::filesystem::path_const&)::_lambda(auto:1_const&)_1_>
              (&local_20,&local_28,(anon_class_8_1_8991fb9c)this);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_28.m_imp);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_20.m_imp);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
              ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&local_30);
  }
  return;
}

Assistant:

void tryLoadModulesInPath(const boost::filesystem::path& directory) {
    if (!boost::filesystem::is_directory(directory)) {
      return;
    }

    const boost::filesystem::directory_iterator end;
    std::for_each(boost::filesystem::directory_iterator(directory), end, [&](const auto& filePath) {
      if (patternMatchModuleLibrary(filePath.path().filename().string())) {
        try {
          this->load(filePath);
        }
        catch (...) {
        }
      }
    });
  }